

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f *
Matrix4f::perspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fLeft,float fRight,float fBottom,float fTop,
          float fZNear,float fZFar,bool directX)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined1 auVar6 [16];
  
  Matrix4f(__return_storage_ptr__,0.0);
  auVar3._4_4_ = in_XMM1_Db;
  auVar3._0_4_ = fRight;
  auVar3._8_4_ = in_XMM1_Dc;
  auVar3._12_4_ = in_XMM1_Dd;
  auVar4._4_4_ = in_XMM0_Db;
  auVar4._0_4_ = fLeft;
  auVar4._8_4_ = in_XMM0_Dc;
  auVar4._12_4_ = in_XMM0_Dd;
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fTop),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fBottom),0x10);
  fVar2 = fZNear + fZNear;
  auVar5 = vsubps_avx(auVar3,auVar4);
  auVar6._0_4_ = auVar4._0_4_ + auVar3._0_4_;
  auVar6._4_4_ = auVar4._4_4_ + auVar3._4_4_;
  auVar6._8_4_ = auVar4._8_4_ + auVar3._8_4_;
  auVar6._12_4_ = auVar4._12_4_ + auVar3._12_4_;
  auVar3 = vdivps_avx(auVar6,auVar5);
  __return_storage_ptr__->m_elements[0] = fVar2 / auVar5._0_4_;
  auVar4 = vmovshdup_avx(auVar5);
  __return_storage_ptr__->m_elements[5] = fVar2 / auVar4._0_4_;
  uVar1 = vmovlps_avx(auVar3);
  *(undefined8 *)(__return_storage_ptr__->m_elements + 8) = uVar1;
  __return_storage_ptr__->m_elements[0xb] = -1.0;
  __return_storage_ptr__->m_elements[10] =
       (float)((uint)directX * (int)fZFar + (uint)!directX * (int)(fZNear + fZFar)) /
       (fZNear - fZFar);
  __return_storage_ptr__->m_elements[0xe] =
       ((float)((uint)directX * (int)fZNear + (uint)!directX * (int)fVar2) * fZFar) /
       (fZNear - fZFar);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fLeft, float fRight,
										 float fBottom, float fTop,
										 float fZNear, float fZFar,
										 bool directX )
{
	Matrix4f projection; // zero matrix

	projection( 0, 0 ) = ( 2.0f * fZNear ) / ( fRight - fLeft );
	projection( 1, 1 ) = ( 2.0f * fZNear ) / ( fTop - fBottom );
	projection( 0, 2 ) = ( fRight + fLeft ) / ( fRight - fLeft );
	projection( 1, 2 ) = ( fTop + fBottom ) / ( fTop - fBottom );
	projection( 3, 2 ) = -1;

	if( directX )
	{
		projection( 2, 2 ) = fZFar / ( fZNear - fZFar);
		projection( 2, 3 ) = ( fZNear * fZFar ) / ( fZNear - fZFar );
	}
	else
	{
		projection( 2, 2 ) = ( fZNear + fZFar ) / ( fZNear - fZFar );
		projection( 2, 3 ) = ( 2.0f * fZNear * fZFar ) / ( fZNear - fZFar );
	}

	return projection;
}